

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlogging.c
# Opt level: O0

void LogBinary(char *comment,void *data,size_t size)

{
  uchar uVar1;
  char cVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  uchar *startPos;
  uchar *bufAsChar;
  size_t i;
  size_t countbuf;
  char hexBuf [49];
  uchar local_48 [8];
  char charBuf [17];
  size_t size_local;
  void *data_local;
  char *comment_local;
  
  i = 0;
  p_Var3 = xlogging_get_log_function();
  if (p_Var3 != (LOGGER_LOG)0x0) {
    (*p_Var3)(AZ_LOG_TRACE,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/xlogging.c"
              ,"LogBinary",0x3b,1,"%s     %lu bytes",comment,size);
  }
  l = (LOGGER_LOG)data;
  startPos = (uchar *)data;
  for (bufAsChar = (uchar *)0x0; bufAsChar < size; bufAsChar = bufAsChar + 1) {
    if ((*startPos < 0x20) || (0x7e < *startPos)) {
      uVar1 = '.';
    }
    else {
      uVar1 = *startPos;
    }
    local_48[i] = uVar1;
    if ((uint)((int)(uint)*startPos >> 4) < 10) {
      cVar2 = (char)((int)(uint)*startPos >> 4) + '0';
    }
    else {
      cVar2 = (char)((int)(uint)*startPos >> 4) + '7';
    }
    hexBuf[i * 3 + -8] = cVar2;
    if ((*startPos & 0xf) < 10) {
      cVar2 = (*startPos & 0xf) + 0x30;
    }
    else {
      cVar2 = (*startPos & 0xf) + 0x37;
    }
    hexBuf[i * 3 + -7] = cVar2;
    hexBuf[i * 3 + -6] = ' ';
    i = i + 1;
    startPos = startPos + 1;
    if (i == 0x10) {
      charBuf[8] = '\0';
      hexBuf[0x28] = '\0';
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_TRACE,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/xlogging.c"
                  ,"LogBinary",0x52,1,"%p: %s    %s",l,&countbuf,local_48);
      }
      i = 0;
      l = (LOGGER_LOG)startPos;
    }
  }
  if (i != 0) {
    local_48[i] = '\0';
    hexBuf[i * 3 + -8] = ' ';
    hexBuf[i * 3 + -7] = ' ';
    hexBuf[i * 3 + -6] = ' ';
    while (sVar4 = i + 1, i < 0xf) {
      hexBuf[sVar4 * 3 + -8] = ' ';
      hexBuf[sVar4 * 3 + -7] = ' ';
      hexBuf[sVar4 * 3 + -6] = ' ';
      i = sVar4;
    }
    hexBuf[sVar4 * 3 + -8] = '\0';
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/xlogging.c"
                ,"LogBinary",0x6b,1,"%p: %s    %s",l,&countbuf,local_48);
    }
  }
  return;
}

Assistant:

void LogBinary(const char* comment, const void* data, size_t size)
{
    char charBuf[LINE_SIZE + 1];
    char hexBuf[LINE_SIZE * 3 + 1];
    size_t countbuf = 0;
    size_t i = 0;
    const unsigned char* bufAsChar = (const unsigned char*)data;
    const unsigned char* startPos = bufAsChar;

    LOG(AZ_LOG_TRACE, LOG_LINE, "%s     %lu bytes", comment, (unsigned long)size);

    /* Print the whole buffer. */
    for (i = 0; i < size; i++)
    {
        /* Store the printable value of the char in the charBuf to print. */
        charBuf[countbuf] = PRINTABLE(*bufAsChar);

        /* Convert the high nibble to a printable hexadecimal value. */
        hexBuf[countbuf * 3] = HEX_STR(*bufAsChar >> 4);

        /* Convert the low nibble to a printable hexadecimal value. */
        hexBuf[countbuf * 3 + 1] = HEX_STR(*bufAsChar);

        hexBuf[countbuf * 3 + 2] = ' ';

        countbuf++;
        bufAsChar++;
        /* If the line is full, print it to start another one. */
        if (countbuf == LINE_SIZE)
        {
            charBuf[countbuf] = '\0';
            hexBuf[countbuf * 3] = '\0';
            LOG(AZ_LOG_TRACE, LOG_LINE, "%p: %s    %s", startPos, hexBuf, charBuf);
            countbuf = 0;
            startPos = bufAsChar;
        }
    }

    /* If the last line does not fit the line size. */
    if (countbuf > 0)
    {
        /* Close the charBuf string. */
        charBuf[countbuf] = '\0';
        hexBuf[countbuf * 3] = ' ';
        hexBuf[countbuf * 3 + 1] = ' ';
        hexBuf[countbuf * 3 + 2] = ' ';

        /* Fill the hexBuf with spaces to keep the charBuf alignment. */
        while ((countbuf++) < LINE_SIZE - 1)
        {
            hexBuf[countbuf * 3] = ' ';
            hexBuf[countbuf * 3 + 1] = ' ';
            hexBuf[countbuf * 3 + 2] = ' ';
        }
        hexBuf[countbuf * 3] = '\0';

        /* Print the last line. */
        LOG(AZ_LOG_TRACE, LOG_LINE, "%p: %s    %s", startPos, hexBuf, charBuf);
    }
}